

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsValidTest::prepareShaderSource
          (ImplicitConversionsValidTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  string *text;
  TestError *this_00;
  reference pvVar1;
  GLchar *pGVar2;
  size_t local_80;
  size_t position;
  GLchar *local_68;
  GLchar *shader_template;
  string *local_40;
  string *value_list;
  GLchar *t2;
  GLchar *t1;
  testCase *test_case;
  shaderSource *out_source_local;
  bool in_use_version_400_local;
  ImplicitConversionsValidTest *pIStack_10;
  SHADER_STAGES in_stage_local;
  ImplicitConversionsValidTest *this_local;
  
  test_case = (testCase *)out_source;
  out_source_local._3_1_ = in_use_version_400;
  out_source_local._4_4_ = in_stage;
  pIStack_10 = this;
  t1 = (GLchar *)getCurrentTestCase(this);
  t2 = Utils::getTypeName((((testCase *)t1)->m_types).m_t1,((testCase *)t1)->m_n_cols,
                          ((testCase *)t1)->m_n_rows);
  value_list = (string *)
               Utils::getTypeName(*(TYPES *)(t1 + 4),*(GLuint *)(t1 + 8),*(GLuint *)(t1 + 0xc));
  getValueList_abi_cxx11_((string *)&shader_template,this,*(GLuint *)(t1 + 8),*(GLuint *)(t1 + 0xc))
  ;
  local_68 = (GLchar *)0x0;
  local_40 = (string *)&shader_template;
  switch(out_source_local._4_4_) {
  case COMPUTE_SHADER:
    local_68 = prepareShaderSource::compute_shader_template;
    break;
  case VERTEX_SHADER:
    local_68 = prepareShaderSource::vertex_shader_template;
    break;
  case TESS_CTRL_SHADER:
    local_68 = prepareShaderSource::tess_ctrl_shader_template;
    break;
  case TESS_EVAL_SHADER:
    local_68 = prepareShaderSource::tess_eval_shader_template;
    break;
  case GEOMETRY_SHADER:
    local_68 = prepareShaderSource::geometry_shader_template;
    break;
  case FRAGMENT_SHADER:
    local_68 = prepareShaderSource::fragment_shader_template;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x119a);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGVar2 = local_68;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  std::__cxx11::string::operator=((string *)pvVar1,pGVar2);
  local_80 = 0;
  pGVar2 = TestBase::getVersionString
                     ((TestBase *)this,out_source_local._4_4_,(bool)(out_source_local._3_1_ & 1));
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceToken("VERSION",&local_80,pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::function_definition;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceToken("FUNCTION_DEFINITION",&local_80,pGVar2,&pvVar1->m_code);
  pGVar2 = prepareShaderSource::verification_snippet;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceToken("VERIFICATION",&local_80,pGVar2,&pvVar1->m_code);
  pGVar2 = (GLchar *)std::__cxx11::string::c_str();
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceAllTokens("VALUE_LIST",pGVar2,&pvVar1->m_code);
  pGVar2 = t2;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceAllTokens("T1",pGVar2,&pvVar1->m_code);
  text = value_list;
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         *)test_case,0);
  Utils::replaceAllTokens("T2",(GLchar *)text,&pvVar1->m_code);
  std::__cxx11::string::~string((string *)&shader_template);
  return;
}

Assistant:

void ImplicitConversionsValidTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
													   Utils::shaderSource& out_source)
{
	static const GLchar* function_definition = "T1 function(in T2 left, in T2 right)\n"
											   "{\n"
											   "    return left + right;\n"
											   "}\n";

	static const GLchar* verification_snippet = "    const T2 const_left  = T2(VALUE_LIST);\n"
												"    const T2 const_right = T2(VALUE_LIST);\n"
												"\n"
												"    T1 const_result = function(const_left, const_right);\n"
												"\n"
												"    T1 literal_result = function(T2(VALUE_LIST), T2(VALUE_LIST));\n"
												"\n"
												"    T2 var_left  = uni_left;\n"
												"    T2 var_right = uni_right;\n"
												"\n"
												"    T1 var_result = function(var_left, var_right);\n"
												"\n"
												"    if ((literal_result != const_result) ||\n"
												"        (const_result   != var_result) )\n"
												"    {\n"
												"        result = vec4(1, 0, 0, 1);\n"
												"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"          uniform T2 uni_left;\n"
		"          uniform T2 uni_right;\n"
		"\n"
		"FUNCTION_DEFINITION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"uniform T2 uni_left;\n"
													"uniform T2 uni_right;\n"
													"\n"
													"FUNCTION_DEFINITION"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"uniform T2 uni_left;\n"
													"uniform T2 uni_right;\n"
													"\n"
													"FUNCTION_DEFINITION"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"uniform T2 uni_left;\n"
		"uniform T2 uni_right;\n"
		"\n"
		"FUNCTION_DEFINITION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "uniform T2 uni_left;\n"
													 "uniform T2 uni_right;\n"
													 "\n"
													 "FUNCTION_DEFINITION"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "uniform T2 uni_left;\n"
												  "uniform T2 uni_right;\n"
												  "\n"
												  "FUNCTION_DEFINITION"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const testCase&	test_case  = getCurrentTestCase();
	const GLchar*	  t1		  = Utils::getTypeName(test_case.m_types.m_t1, test_case.m_n_cols, test_case.m_n_rows);
	const GLchar*	  t2		  = Utils::getTypeName(test_case.m_types.m_t2, test_case.m_n_cols, test_case.m_n_rows);
	const std::string& value_list = getValueList(test_case.m_n_cols, test_case.m_n_rows);
	const GLchar*	  shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("FUNCTION_DEFINITION", position, function_definition, out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("VALUE_LIST", value_list.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("T1", t1, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("T2", t2, out_source.m_parts[0].m_code);
}